

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O3

void av1d_frame_unref(Av1CodecContext *ctx,AV1Frame *f)

{
  RefInfo_conflict *ptr;
  uint uVar1;
  MppBuffer framebuf;
  MppBuffer local_20;
  
  f->raw_frame_header = (AV1RawFrameHeader *)0x0;
  f->temporal_id = 0;
  f->spatial_id = 0;
  memset(f->skip_mode_frame_idx,0,0xa9);
  ptr = f->ref;
  if (((ptr != (RefInfo_conflict *)0x0) && (0 < ptr->ref_count)) && (f->slot_index < 0x7f)) {
    uVar1 = ptr->ref_count - 1;
    ptr->ref_count = uVar1;
    if (((byte)av1d_debug & 4) != 0) {
      _mpp_log_l(4,"av1d_parser","ref %p, f->ref->ref_count %d, ref->invisible= %d",
                 "av1d_frame_unref",ptr,(ulong)uVar1,ptr->invisible);
      ptr = f->ref;
      uVar1 = ptr->ref_count;
    }
    if (uVar1 == 0) {
      uVar1 = f->slot_index;
      if ((int)uVar1 < 0x7f) {
        if (((byte)av1d_debug & 4) != 0) {
          _mpp_log_l(4,"av1d_parser","clr f->slot_index = %d","av1d_frame_unref",(ulong)uVar1);
          ptr = f->ref;
          uVar1 = f->slot_index;
        }
        if (ptr->is_output == 0) {
          local_20 = (MppBuffer)0x0;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)(ctx[0x24].pic_params.ref_order_hint + 5),uVar1,SLOT_BUFFER,
                     &local_20);
          if (((byte)av1d_debug & 4) != 0) {
            _mpp_log_l(4,"av1d_parser","free framebuf prt %p","av1d_frame_unref",local_20);
          }
          if (local_20 != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(local_20,"av1d_frame_unref");
          }
          f->ref->invisible = 0;
          uVar1 = f->slot_index;
        }
        mpp_buf_slot_clr_flag
                  (*(MppBufSlots *)(ctx[0x24].pic_params.ref_order_hint + 5),uVar1,SLOT_CODEC_USE);
        ptr = f->ref;
      }
      f->slot_index = 0xff;
      mpp_osal_free("av1d_frame_unref",ptr);
    }
    f->ref = (RefInfo_conflict *)0x0;
    return;
  }
  _mpp_log_l(2,"av1d_parser","ref count alreay is zero",(char *)0x0);
  return;
}

Assistant:

static void av1d_frame_unref(Av1CodecContext *ctx, AV1Frame *f)
{
    AV1Context *s = ctx->priv_data;
    f->raw_frame_header = NULL;
    f->spatial_id = f->temporal_id = 0;
    memset(f->skip_mode_frame_idx, 0,
           2 * sizeof(uint8_t));
    memset(&f->film_grain, 0, sizeof(f->film_grain));

    f->coded_lossless = 0;

    if (!f->ref || f->ref->ref_count <= 0 || f->slot_index >= 0x7f) {
        mpp_err("ref count alreay is zero");
        return;
    }

    f->ref->ref_count--;
    av1d_dbg(AV1D_DBG_REF, "ref %p, f->ref->ref_count %d, ref->invisible= %d", f->ref, f->ref->ref_count, f->ref->invisible);
    if (!f->ref->ref_count) {
        if (f->slot_index < 0x7f) {
            av1d_dbg(AV1D_DBG_REF, "clr f->slot_index = %d",  f->slot_index);
            /* if pic no output for disaplay when ref_cnt
               clear we will free this buffer directly,
               maybe cause some frame can't display    */
            // if (f->ref->invisible && !f->ref->is_output) {
            if (!f->ref->is_output) {
                MppBuffer framebuf = NULL;
                mpp_buf_slot_get_prop(s->slots, f->slot_index, SLOT_BUFFER, &framebuf);
                av1d_dbg(AV1D_DBG_REF, "free framebuf prt %p", framebuf);
                if (framebuf)
                    mpp_buffer_put(framebuf);
                f->ref->invisible = 0;
            }
            mpp_buf_slot_clr_flag(s->slots, f->slot_index, SLOT_CODEC_USE);
        }
        f->slot_index = 0xff;
        mpp_free(f->ref);
        f->ref = NULL;
    }
    f->ref = NULL;
}